

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_comparison_unit.c
# Opt level: O2

void generic_subset_test(uint8_t type1,uint8_t type2)

{
  _Bool _Var1;
  container_t *c1;
  container_t *c2;
  char cVar2;
  int iVar3;
  byte bVar4;
  
  c1 = container_create(type1);
  c2 = container_create(type2);
  _Var1 = container_is_subset(c1,type1,c2,type2);
  _assert_true((ulong)_Var1,"container_is_subset(container1, type1, container2, type2)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
               ,0xa4);
  for (iVar3 = 0; iVar3 != 0x44c; iVar3 = iVar3 + 0xb) {
    container_checked_add(c1,(uint16_t)iVar3,type1);
    container_checked_add(c2,(uint16_t)iVar3,type2);
    _Var1 = container_is_subset(c1,type1,c2,type2);
    _assert_true((ulong)_Var1,"container_is_subset(container1, type1, container2, type2)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
                 ,0xa8);
  }
  for (iVar3 = 0; iVar3 != 700; iVar3 = iVar3 + 7) {
    container_checked_add(c2,(uint16_t)iVar3,type2);
    _Var1 = container_is_subset(c1,type1,c2,type2);
    _assert_true((ulong)_Var1,"container_is_subset(container1, type1, container2, type2)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
                 ,0xac);
  }
  bVar4 = 0;
  cVar2 = '\0';
  iVar3 = 0;
  while( true ) {
    if (iVar3 == 500) break;
    if (((byte)((bVar4 / 7) * '\a' + cVar2) != '\0') &&
       ((byte)((bVar4 / 0xb) * '\v' + cVar2) != '\0')) {
      container_checked_add(c1,(uint16_t)iVar3,type1);
      _Var1 = container_is_subset(c1,type1,c2,type2);
      _assert_true((ulong)!_Var1,"container_is_subset(container1, type1, container2, type2)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
                   ,0xb1);
      container_checked_add(c2,(uint16_t)iVar3,type2);
      _Var1 = container_is_subset(c1,type1,c2,type2);
      _assert_true((ulong)_Var1,"container_is_subset(container1, type1, container2, type2)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
                   ,0xb3);
    }
    iVar3 = iVar3 + 5;
    cVar2 = cVar2 + -1;
    bVar4 = bVar4 + 1;
  }
  container_free(c1,type1);
  container_free(c2,type2);
  return;
}

Assistant:

void generic_subset_test(uint8_t type1, uint8_t type2) {
    container_t *container1 = container_create(type1);
    container_t *container2 = container_create(type2);
    assert_true(container_is_subset(container1, type1, container2, type2));
    for (int i = 0; i < 100; i++) {
        container_checked_add(container1, i * 11, type1);
        container_checked_add(container2, i * 11, type2);
        assert_true(container_is_subset(container1, type1, container2, type2));
    }
    for (int i = 0; i < 100; i++) {
        container_checked_add(container2, i * 7, type2);
        assert_true(container_is_subset(container1, type1, container2, type2));
    }
    for (int i = 0; i < 100; i++) {
        if (i % 7 == 0 || i % 11 == 0) continue;
        container_checked_add(container1, i * 5, type1);
        assert_false(container_is_subset(container1, type1, container2, type2));
        container_checked_add(container2, i * 5, type2);
        assert_true(container_is_subset(container1, type1, container2, type2));
    }
    container_free(container1, type1);
    container_free(container2, type2);
}